

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

long __thiscall UniValue::getInt<long>(UniValue *this)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  runtime_error *this_00;
  errc eVar5;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long> _Var6;
  char *first_nonmatching;
  long result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  int __base;
  long *in_stack_ffffffffffffffb0;
  VType *in_stack_ffffffffffffffb8;
  UniValue *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long local_18;
  
  __base = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  checkType(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            (in_stack_ffffffffffffff78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
            (in_stack_ffffffffffffff78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffff78);
  _Var6 = std::from_chars<long>
                    ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__base);
  pcVar2 = _Var6.ptr;
  eVar5 = _Var6.ec;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffff78);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_ffffffffffffff78);
  if ((pcVar2 == pcVar3 + sVar4) && (eVar5 == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_18;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON integer out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

Int UniValue::getInt() const
{
    static_assert(std::is_integral<Int>::value);
    checkType(VNUM);
    Int result;
    const auto [first_nonmatching, error_condition] = std::from_chars(val.data(), val.data() + val.size(), result);
    if (first_nonmatching != val.data() + val.size() || error_condition != std::errc{}) {
        throw std::runtime_error("JSON integer out of range");
    }
    return result;
}